

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AdsNotification.h
# Opt level: O2

void __thiscall
Notification::Notification
          (Notification *this,PAdsNotificationFuncEx __func,uint32_t __hUser,uint32_t length,
          AmsAddr __amsAddr,uint16_t __port)

{
  pointer puVar1;
  allocator_type local_19;
  
  (this->connection).first = __port;
  (this->connection).second = __amsAddr;
  this->callback = __func;
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
            (&this->buffer,(ulong)length + 0x10,&local_19);
  this->hUser = __hUser;
  puVar1 = (this->buffer).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
           super__Vector_impl_data._M_start;
  puVar1[8] = '\0';
  puVar1[9] = '\0';
  puVar1[10] = '\0';
  puVar1[0xb] = '\0';
  *(uint32_t *)(puVar1 + 0xc) = length;
  return;
}

Assistant:

Notification(PAdsNotificationFuncEx __func,
                 uint32_t               __hUser,
                 uint32_t               length,
                 AmsAddr                __amsAddr,
                 uint16_t               __port)
        : connection({__port, __amsAddr}),
        callback(__func),
        buffer(sizeof(AdsNotificationHeader) + length),
        hUser(__hUser)
    {
        auto header = reinterpret_cast<AdsNotificationHeader*>(buffer.data());
        header->hNotification = 0;
        header->cbSampleSize = length;
    }